

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfw_main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  LumeviewError *this;
  int frmBufHeight;
  int frmBufWidth;
  allocator local_1c9;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [23];
  
  glfwSetErrorCallback(HandleGLFWError);
  glfwInit();
  glfwWindowHint(0x22002,3);
  glfwWindowHint(0x22003,3);
  glfwWindowHint(0x22008,0x32001);
  handle = glfwCreateWindow(800,600,"lumeview",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle != (GLFWwindow *)0x0) {
    glfwMakeContextCurrent(handle);
    glfwSwapInterval(1);
    lumeview::LumeviewInit();
    if (argc == 2) {
      std::__cxx11::string::string((string *)local_1a8,argv[1],&local_1c9);
      lumeview::CreateSceneForMesh((lumeview *)&local_1c8,(string *)local_1a8);
      lumeview::Lumeview::set_scene(&g_lumeview,(SPScene *)&local_1c8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._M_string_length);
      }
      if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != local_1a8 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),
                        local_198[0]._M_allocated_capacity + 1);
      }
    }
    else {
      lumeview::CreateSampleScene();
      lumeview::Lumeview::set_scene(&g_lumeview,(SPScene *)local_1a8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
      }
    }
    lumeview::ImGui_SetClipboardCallbacks(ImGui_GetClipboardText,ImGui_SetClipboardText,handle);
    glfwSetCursorPosCallback(handle,CursorPositionCallback);
    glfwSetMouseButtonCallback(handle,MouseButtonCallback);
    glfwSetScrollCallback(handle,ScrollCallback);
    glfwSetKeyCallback(handle,KeyCallback);
    glfwSetCharCallback(handle,CharCallback);
    glfwGetFramebufferSize(handle,(int *)local_1a8,(int *)&local_1c8);
    FramebufferResized(handle,local_1a8._0_4_,(int)local_1c8._M_dataplus._M_p);
    glfwSetFramebufferSizeCallback(handle,FramebufferResized);
    while( true ) {
      iVar1 = glfwWindowShouldClose(handle);
      if (iVar1 != 0) break;
      lumeview::Lumeview::process_gui(&g_lumeview);
      lumeview::Lumeview::render(&g_lumeview);
      glfwSwapBuffers(handle);
      glfwPollEvents();
    }
    lumeview::Lumeview::clear(&g_lumeview);
    lumeview::LumeviewShutdown();
    glfwTerminate();
    return 0;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a8 + 0x10),"GLFW::INIT\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a8 + 0x10),"Failed to create glfw window",0x1c);
  this = (LumeviewError *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  lumeview::LumeviewError::LumeviewError(this,&local_1c8);
  __cxa_throw(this,&lumeview::LumeviewError::typeinfo,lumeview::LumeviewError::~LumeviewError);
}

Assistant:

int main (int argc, char** argv)
{
	int retVal = 0;

	try {
		glfwSetErrorCallback (HandleGLFWError);
		glfwInit ();
		glfwWindowHint (GLFW_CONTEXT_VERSION_MAJOR, USE_GL_VERSION_MAJOR);
		glfwWindowHint (GLFW_CONTEXT_VERSION_MINOR, USE_GL_VERSION_MINOR);
		if((USE_GL_VERSION_MAJOR >= 3) && (USE_GL_VERSION_MINOR >= 2))
			glfwWindowHint (GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

	//	add for OSX:
		#ifdef __APPLE__
			glfwWindowHint (GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
		#endif

	//	Set up window
		GLFWwindow* window = glfwCreateWindow (800, 600, "lumeview", NULL, NULL);
		COND_THROW (window == NULL, "GLFW::INIT\n" <<
		            "Failed to create glfw window");

		glfwMakeContextCurrent (window);
		glfwSwapInterval(1);

		LumeviewInit ();
		
	//	if a filename was specified, we'll load that, if not, we'll create a sample scene
		if (argc == 2)
			g_lumeview.set_scene (CreateSceneForMesh (argv[1]));
		else
			g_lumeview.set_scene (CreateSampleScene ());

	    InitImGui (window);

	    glfwSetCursorPosCallback (window, CursorPositionCallback);
	    glfwSetMouseButtonCallback (window, MouseButtonCallback);
	    glfwSetScrollCallback (window, ScrollCallback);
	    glfwSetKeyCallback (window, KeyCallback);
	    glfwSetCharCallback (window, CharCallback);

	//	setup view
	    int frmBufWidth, frmBufHeight;
	    glfwGetFramebufferSize (window, &frmBufWidth, &frmBufHeight);
		FramebufferResized (window, frmBufWidth, frmBufHeight);
		glfwSetFramebufferSizeCallback (window, FramebufferResized);

		while (!glfwWindowShouldClose (window))
		{
			g_lumeview.process_gui ();
			g_lumeview.render ();
			
			glfwSwapBuffers (window);
			glfwPollEvents ();
		}

	} catch (FileNotFoundError& e) {
		cout << "\nAn ERROR occurred during execution:\n";
		cout << "File not found: " << e.what() << endl << endl;
		retVal = 1;
	}
	catch (std::exception& e) {
		cout << "\nAn ERROR occurred during execution:\n";
		cout << e.what() << endl << endl;
		retVal = 1;
	}

	g_lumeview.clear();
	lumeview::LumeviewShutdown ();
	glfwTerminate ();
	return retVal;
}